

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mldsa.cc
# Opt level: O3

int MLDSA65_sign(uint8_t *out_encoded_signature,MLDSA65_private_key *private_key,uint8_t *msg,
                size_t msg_len,uint8_t *context,size_t context_len)

{
  uint uVar1;
  bcm_status bVar2;
  
  uVar1 = 0;
  if (context_len < 0x100) {
    bVar2 = BCM_mldsa65_sign(out_encoded_signature,(BCM_mldsa65_private_key *)private_key,msg,
                             msg_len,context,context_len);
    uVar1 = (uint)(bVar2 < failure);
  }
  return uVar1;
}

Assistant:

int MLDSA65_sign(uint8_t out_encoded_signature[MLDSA65_SIGNATURE_BYTES],
                 const struct MLDSA65_private_key *private_key,
                 const uint8_t *msg, size_t msg_len, const uint8_t *context,
                 size_t context_len) {
  if (context_len > 255) {
    return 0;
  }
  return bcm_success(BCM_mldsa65_sign(
      out_encoded_signature,
      reinterpret_cast<const BCM_mldsa65_private_key *>(private_key), msg,
      msg_len, context, context_len));
}